

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O3

void __thiscall BVStatic<4096UL>::ClearRange(BVStatic<4096UL> *this,BVIndex index,uint length)

{
  sbyte sVar1;
  ulong uVar2;
  uint uVar3;
  Type *__s;
  
  AssertRange(this,index);
  AssertRange(this,(index + length) - 1);
  AssertRange(this,index);
  __s = this->data + (index >> 6);
  sVar1 = (sbyte)(index & 0x3f);
  if ((index & 0x3f) + length < 0x41) {
    uVar2 = (0xffffffffffffffffU >> (-(char)length & 0x3fU)) << sVar1;
  }
  else {
    __s->word = __s->word & ~(-1L << sVar1);
    uVar3 = (index | 0xffffffc0) + length;
    __s = __s + 1;
    if (0x3f < uVar3) {
      uVar2 = (ulong)(uVar3 - 0x40 >> 6);
      memset(__s,0,uVar2 * 8 + 8);
      uVar3 = uVar3 & 0x3f;
      __s = this->data + (ulong)(index >> 6) + uVar2 + 2;
    }
    if (uVar3 == 0) {
      return;
    }
    uVar2 = 0xffffffffffffffff >> (-(char)uVar3 & 0x3fU);
  }
  __s->word = __s->word & ~uVar2;
  return;
}

Assistant:

void ClearRange(const BVIndex index, uint length)
    {
        AssertRange(index);
        AssertRange(index + length - 1);

        BVUnit * bvUnit = BitsFromIndex(index);
        uint offset = BVUnit::Offset(index);

        if (offset + length <= BVUnit::BitsPerWord)
        {
            // Bit range is in a single word
            return bvUnit->ClearRange(offset, length);
        }

        // Bit range spans words.
        // Clear the first word, from start offset to end of word
        bvUnit->ClearRange(offset, (BVUnit::BitsPerWord - offset));

        bvUnit++;
        length -= (BVUnit::BitsPerWord - offset);

        // Set entire words until we are at the last word
        while (length >= BVUnit::BitsPerWord)
        {
            bvUnit->ClearAll();

            bvUnit++;
            length -= BVUnit::BitsPerWord;
        }

        // Set last word (unless we already ended on a word boundary)
        if (length > 0)
        {
            bvUnit->ClearRange(0, length);
        }
    }